

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

Bool BlockStyle(TidyDocImpl *doc,Node *node,Node **pnode)

{
  Bool BVar1;
  ctmbstr local_38;
  ctmbstr CSSeq;
  Node *child;
  Node **pnode_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  child = (Node *)pnode;
  pnode_local = &node->parent;
  node_local = &doc->root;
  if ((((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) && (node->tag->id == TidyTag_TABLE)) ||
     (((((node != (Node *)0x0 && (node->tag != (Dict *)0x0)) && (node->tag->id == TidyTag_TD)) ||
       (((node != (Node *)0x0 && (node->tag != (Dict *)0x0)) && (node->tag->id == TidyTag_TH)))) ||
      (((node != (Node *)0x0 && (node->tag != (Dict *)0x0)) && (node->tag->id == TidyTag_TR)))))) {
    TableBgColor(doc,node);
  }
  BVar1 = CanApplyBlockStyle((Node *)pnode_local);
  if (BVar1 != no) {
    if (((pnode_local == (Node **)0x0) || (pnode_local[7] == (Node *)0x0)) ||
       (*(int *)&pnode_local[7]->parent != 0x13)) {
      TextAlign((TidyDocImpl *)node_local,(Node *)pnode_local);
    }
    CSSeq = (ctmbstr)pnode_local[3];
    if ((Node *)CSSeq == (Node *)0x0) {
      return no;
    }
    if (((Node *)CSSeq)->next != (Node *)0x0) {
      return no;
    }
    BVar1 = FindCSSSpanEq((Node *)CSSeq,&local_38,no);
    if (BVar1 != no) {
      MergeStyles((TidyDocImpl *)node_local,(Node *)pnode_local,(Node *)CSSeq);
      prvTidyAddStyleProperty((TidyDocImpl *)node_local,(Node *)pnode_local,local_38);
      StripOnlyChild((TidyDocImpl *)node_local,(Node *)pnode_local);
      return yes;
    }
    if (((CSSeq != (ctmbstr)0x0) && (*(long *)(CSSeq + 0x38) != 0)) &&
       (**(int **)(CSSeq + 0x38) == 0x24)) {
      MergeStyles((TidyDocImpl *)node_local,(Node *)pnode_local,(Node *)CSSeq);
      AddFontStyles((TidyDocImpl *)node_local,(Node *)pnode_local,*(AttVal **)(CSSeq + 0x28));
      StripOnlyChild((TidyDocImpl *)node_local,(Node *)pnode_local);
      return yes;
    }
  }
  return no;
}

Assistant:

static Bool BlockStyle( TidyDocImpl* doc, Node *node, Node **ARG_UNUSED(pnode) )
{
    Node *child;
    ctmbstr CSSeq;

    /* check for bgcolor */
    if (   nodeIsTABLE(node)
        || nodeIsTD(node) || nodeIsTH(node) || nodeIsTR( node ))
        TableBgColor( doc, node );

    if (CanApplyBlockStyle(node))
    {
        /* check for align attribute */
        if ( !nodeIsCAPTION(node) )
            TextAlign( doc, node );

        child = node->content;
        if (child == NULL)
            return no;

        /* check child has no peers */
        if (child->next)
            return no;

        if ( FindCSSSpanEq(child, &CSSeq, no) )
        {
            MergeStyles( doc, node, child );
            TY_(AddStyleProperty)( doc, node, CSSeq );
            StripOnlyChild( doc, node );
            return yes;
        }
        else if ( nodeIsFONT(child) )
        {
            MergeStyles( doc, node, child );
            AddFontStyles( doc, node, child->attributes );
            StripOnlyChild( doc, node );
            return yes;
        }
    }

    return no;
}